

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

boolean not_fully_identified_core(obj *otmp,boolean ignore_bknown)

{
  boolean bVar1;
  bool local_1a;
  boolean ignore_bknown_local;
  obj *otmp_local;
  
  if (otmp->oclass == '\f') {
    otmp_local._7_1_ = false;
  }
  else if (((((*(uint *)&otmp->field_0x4a >> 4 & 1) == 0) ||
            ((*(uint *)&otmp->field_0x4a >> 5 & 1) == 0)) ||
           ((ignore_bknown == '\0' && ((*(uint *)&otmp->field_0x4a >> 6 & 1) == 0)))) ||
          ((objects[otmp->otyp].field_0x10 & 1) == 0)) {
    otmp_local._7_1_ = true;
  }
  else if ((otmp->oprops_known & otmp->oprops & 0xfffffU) == otmp->oprops) {
    if ((otmp->oartifact != '\0') && (bVar1 = undiscovered_artifact(otmp->oartifact), bVar1 != '\0')
       ) {
      return '\x01';
    }
    if (((*(uint *)&otmp->field_0x4a >> 7 & 1) == 0) &&
       ((((otmp->oclass == '\x03' || (otmp->oclass == '\x02')) ||
         ((otmp->oclass == '\x06' && (objects[otmp->otyp].oc_subtyp != '\0')))) ||
        (otmp->oclass == '\x0f')))) {
      local_1a = true;
      if ((((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) != 0xb) &&
          (local_1a = true, (*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) != 0xd)) &&
         (local_1a = true, (*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) != 0xb)) {
        bVar1 = is_flammable(otmp);
        local_1a = bVar1 != '\0';
      }
      otmp_local._7_1_ = local_1a;
    }
    else {
      otmp_local._7_1_ = false;
    }
  }
  else {
    otmp_local._7_1_ = true;
  }
  return otmp_local._7_1_;
}

Assistant:

boolean not_fully_identified_core(const struct obj *otmp, boolean ignore_bknown)
{
    /* gold doesn't have any interesting attributes [yet?] */
    if (otmp->oclass == COIN_CLASS) return FALSE;	/* always fully ID'd */

    /* check fundamental ID hallmarks first */
    if (!otmp->known || !otmp->dknown || (!ignore_bknown && !otmp->bknown) ||
	    !objects[otmp->otyp].oc_name_known)	/* ?redundant? */
	return TRUE;
    if ((otmp->oprops_known & otmp->oprops & ITEM_PROP_MASK) != otmp->oprops)
	return TRUE;
    if (otmp->oartifact && undiscovered_artifact(otmp->oartifact))
	return TRUE;
    /* otmp->rknown is the only item of interest if we reach here */
       /*
	*  Note:  if a revision ever allows scrolls to become fireproof or
	*  rings to become shockproof, this checking will need to be revised.
	*  `rknown' ID only matters if xname() will provide the info about it.
	*/
    if (otmp->rknown || (otmp->oclass != ARMOR_CLASS &&
			 otmp->oclass != WEAPON_CLASS &&
			 !is_weptool(otmp) &&		    /* (redunant) */
			 otmp->oclass != BALL_CLASS))	    /* (useless) */
	return FALSE;
    else	/* lack of `rknown' only matters for vulnerable objects */
	return (boolean)(is_rustprone(otmp) ||
			 is_corrodeable(otmp) ||
			 is_flammable(otmp));
}